

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatasetBuilder.cpp
# Opt level: O1

bool __thiscall DatasetBuilder::can_still_add(DatasetBuilder *this,uint64_t bytes)

{
  pointer puVar1;
  IndexBuilder *pIVar2;
  int iVar3;
  long lVar4;
  pointer puVar5;
  pointer puVar6;
  ulong uVar7;
  
  puVar5 = (this->indices).
           super__Vector_base<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>,_std::allocator<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar7 = (long)(this->fids).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->fids).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 5;
  puVar1 = (this->indices).
           super__Vector_base<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>,_std::allocator<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)puVar1 - (long)puVar5 >> 5;
  if (0 < lVar4) {
    lVar4 = lVar4 + 1;
    puVar5 = puVar5 + 2;
    do {
      puVar6 = puVar5;
      pIVar2 = puVar6[-2]._M_t.
               super___uniq_ptr_impl<IndexBuilder,_std::default_delete<IndexBuilder>_>._M_t.
               super__Tuple_impl<0UL,_IndexBuilder_*,_std::default_delete<IndexBuilder>_>.
               super__Head_base<0UL,_IndexBuilder_*,_false>._M_head_impl;
      iVar3 = (*pIVar2->_vptr_IndexBuilder[4])(pIVar2,bytes,uVar7 & 0xffffffff);
      if ((char)iVar3 == '\0') {
        puVar6 = puVar6 + -2;
        goto LAB_0015224b;
      }
      pIVar2 = puVar6[-1]._M_t.
               super___uniq_ptr_impl<IndexBuilder,_std::default_delete<IndexBuilder>_>._M_t.
               super__Tuple_impl<0UL,_IndexBuilder_*,_std::default_delete<IndexBuilder>_>.
               super__Head_base<0UL,_IndexBuilder_*,_false>._M_head_impl;
      iVar3 = (*pIVar2->_vptr_IndexBuilder[4])(pIVar2,bytes,uVar7 & 0xffffffff);
      if ((char)iVar3 == '\0') {
        puVar6 = puVar6 + -1;
        goto LAB_0015224b;
      }
      pIVar2 = (puVar6->_M_t).
               super___uniq_ptr_impl<IndexBuilder,_std::default_delete<IndexBuilder>_>._M_t.
               super__Tuple_impl<0UL,_IndexBuilder_*,_std::default_delete<IndexBuilder>_>.
               super__Head_base<0UL,_IndexBuilder_*,_false>._M_head_impl;
      iVar3 = (*pIVar2->_vptr_IndexBuilder[4])(pIVar2,bytes,uVar7 & 0xffffffff);
      if ((char)iVar3 == '\0') goto LAB_0015224b;
      pIVar2 = puVar6[1]._M_t.
               super___uniq_ptr_impl<IndexBuilder,_std::default_delete<IndexBuilder>_>._M_t.
               super__Tuple_impl<0UL,_IndexBuilder_*,_std::default_delete<IndexBuilder>_>.
               super__Head_base<0UL,_IndexBuilder_*,_false>._M_head_impl;
      iVar3 = (*pIVar2->_vptr_IndexBuilder[4])(pIVar2,bytes,uVar7 & 0xffffffff);
      if ((char)iVar3 == '\0') {
        puVar6 = puVar6 + 1;
        goto LAB_0015224b;
      }
      lVar4 = lVar4 + -1;
      puVar5 = puVar6 + 4;
    } while (1 < lVar4);
    puVar5 = puVar6 + 2;
  }
  lVar4 = (long)puVar1 - (long)puVar5 >> 3;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      puVar6 = puVar1;
      if ((lVar4 != 3) ||
         (pIVar2 = (puVar5->_M_t).
                   super___uniq_ptr_impl<IndexBuilder,_std::default_delete<IndexBuilder>_>._M_t.
                   super__Tuple_impl<0UL,_IndexBuilder_*,_std::default_delete<IndexBuilder>_>.
                   super__Head_base<0UL,_IndexBuilder_*,_false>._M_head_impl,
         iVar3 = (*pIVar2->_vptr_IndexBuilder[4])(pIVar2,bytes,uVar7 & 0xffffffff), puVar6 = puVar5,
         (char)iVar3 == '\0')) goto LAB_0015224b;
      puVar5 = puVar5 + 1;
    }
    pIVar2 = (puVar5->_M_t).super___uniq_ptr_impl<IndexBuilder,_std::default_delete<IndexBuilder>_>.
             _M_t.super__Tuple_impl<0UL,_IndexBuilder_*,_std::default_delete<IndexBuilder>_>.
             super__Head_base<0UL,_IndexBuilder_*,_false>._M_head_impl;
    iVar3 = (*pIVar2->_vptr_IndexBuilder[4])(pIVar2,bytes,uVar7 & 0xffffffff);
    puVar6 = puVar5;
    if ((char)iVar3 == '\0') goto LAB_0015224b;
    puVar5 = puVar5 + 1;
  }
  pIVar2 = (puVar5->_M_t).super___uniq_ptr_impl<IndexBuilder,_std::default_delete<IndexBuilder>_>.
           _M_t.super__Tuple_impl<0UL,_IndexBuilder_*,_std::default_delete<IndexBuilder>_>.
           super__Head_base<0UL,_IndexBuilder_*,_false>._M_head_impl;
  iVar3 = (*pIVar2->_vptr_IndexBuilder[4])(pIVar2,bytes,uVar7 & 0xffffffff);
  puVar6 = puVar5;
  if ((char)iVar3 != '\0') {
    puVar6 = puVar1;
  }
LAB_0015224b:
  return puVar6 == puVar1;
}

Assistant:

bool DatasetBuilder::can_still_add(uint64_t bytes) const {
    auto can_add_bytes = [bytes, fcount = fids.size()](const auto &ndx) {
        return ndx->can_still_add(bytes, fcount);
    };
    return std::all_of(std::cbegin(indices), std::cend(indices), can_add_bytes);
}